

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

LINK_ENDPOINT_INSTANCE *
find_link_endpoint_by_input_handle(SESSION_INSTANCE *session,handle input_handle)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (session->link_endpoint_count == uVar1) {
      return (LINK_ENDPOINT_INSTANCE *)0x0;
    }
    if (session->link_endpoints[uVar1]->input_handle == input_handle) break;
    uVar1 = uVar1 + 1;
  }
  if (session->link_endpoint_count != (uint)uVar1) {
    return session->link_endpoints[uVar1];
  }
  return (LINK_ENDPOINT_INSTANCE *)0x0;
}

Assistant:

static LINK_ENDPOINT_INSTANCE* find_link_endpoint_by_input_handle(SESSION_INSTANCE* session, handle input_handle)
{
    uint32_t i;
    LINK_ENDPOINT_INSTANCE* result;

    for (i = 0; i < session->link_endpoint_count; i++)
    {
        if (session->link_endpoints[i]->input_handle == input_handle)
        {
            break;
        }
    }

    if (i == session->link_endpoint_count)
    {
        result = NULL;
    }
    else
    {
        result = session->link_endpoints[i];
    }

    return result;
}